

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O3

void __thiscall upb::generator::Plugin::Plugin(Plugin *this)

{
  upb_Arena *puVar1;
  upb_DefPool *puVar2;
  
  puVar1 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  (this->arena_).ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)> =
       (_Tuple_impl<1UL,_void_(*)(upb_Arena_*)>)upb_Arena_Free;
  (this->arena_).ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = puVar1;
  puVar2 = upb_DefPool_New();
  (this->pool_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
  super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false> =
       (_Head_base<1UL,_void_(*)(upb_DefPool_*),_false>)upb_DefPool_Free;
  (this->pool_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = puVar2;
  ReadRequest(this);
  return;
}

Assistant:

Plugin() { ReadRequest(); }